

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGraph.cpp
# Opt level: O2

void __thiscall
Hpipe::InstructionGraph::make_rewind_data(InstructionGraph *this,InstructionRewind *rewind)

{
  long *plVar1;
  InstructionRewind *pIVar2;
  pointer pCVar3;
  Instruction *pIVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  Vec<Hpipe::Transition> *n;
  long lVar8;
  InstructionWithCode *pIVar9;
  pointer pVVar10;
  long lVar11;
  uint nt;
  ulong uVar12;
  uint uVar13;
  InstructionRewind *pIVar14;
  long *plVar15;
  pointer pTVar16;
  Instruction *this_00;
  PtrPool<Hpipe::Instruction,_32> *pPVar17;
  InstructionRewind *pIVar18;
  InstructionRewind *pIVar19;
  CodeSeqItem *csi;
  pointer pCVar20;
  Instruction *pIVar21;
  uint offset_beg;
  InstructionRewind *rewind_local;
  vector<Hpipe::InstructionRewind::CodeSeqItem,std::allocator<Hpipe::InstructionRewind::CodeSeqItem>>
  *local_118;
  uint local_10c;
  InstructionOK *ok;
  InstructionGraph *local_100;
  InstructionWithCode *wc;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  rewind_local = rewind;
  make_rewind_exec(this,(rewind->super_Instruction).mark,rewind);
  if (rewind->exec == (Instruction *)0x0) {
    Context::without_mark((PC *)&wc,&(rewind->super_Instruction).cx);
    std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::operator=(&rewind->ncx,(PC *)&wc);
    std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::~pair((PC *)&wc);
  }
  else {
    local_50._M_unused._M_object = &ok;
    ok = (InstructionOK *)0x0;
    local_50._8_8_ = 0;
    local_38 = std::
               _Function_handler<void_(Hpipe::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/hleclerc[P]Hpipe/src/Hpipe/InstructionGraph.cpp:884:29)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(Hpipe::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/hleclerc[P]Hpipe/src/Hpipe/InstructionGraph.cpp:884:29)>
               ::_M_manager;
    local_100 = this;
    Instruction::apply_rw(rewind->exec,(function<void_(Hpipe::Instruction_*)> *)&local_50,false);
    std::_Function_base::~_Function_base((_Function_base *)&local_50);
    if (ok != (InstructionOK *)0x0) {
      local_118 = (vector<Hpipe::InstructionRewind::CodeSeqItem,std::allocator<Hpipe::InstructionRewind::CodeSeqItem>>
                   *)&rewind->code_seq_end;
      uVar13 = 0;
      pIVar4 = &ok->super_Instruction;
      pIVar21 = (Instruction *)0x0;
      while (this_00 = pIVar4, uVar6 = Instruction::nb_next_rw(this_00),
            uVar6 < (this_00 != &ok->super_Instruction) + 1) {
        wc = (InstructionWithCode *)
             __dynamic_cast(this_00,&Instruction::typeinfo,&InstructionWithCode::typeinfo,0);
        if (wc != (InstructionWithCode *)0x0) {
          if (8 < (ulong)((long)(wc->super_Instruction).cx.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(wc->super_Instruction).cx.pos.
                               super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                               .
                               super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                               ._M_impl.super__Vector_impl_data._M_start)) break;
          iVar7 = (*(wc->super_Instruction)._vptr_Instruction[0x11])(wc);
          offset_beg = 0xffffffff;
          if ((char)iVar7 != '\0') {
            offset_beg = uVar13;
          }
          std::
          vector<Hpipe::InstructionRewind::CodeSeqItem,std::allocator<Hpipe::InstructionRewind::CodeSeqItem>>
          ::emplace_back<unsigned_int,Hpipe::InstructionWithCode*&>(local_118,&offset_beg,&wc);
          wc->in_code_seq = true;
        }
        pTVar16 = (this_00->prev).
                  super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                  super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((long)(this_00->prev).
                  super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                  super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pTVar16 != 0x28) break;
        lVar8 = __dynamic_cast(this_00,&Instruction::typeinfo,&InstructionNextChar::typeinfo,0);
        if ((lVar8 != 0) && (*(char *)(lVar8 + 0x174) == '\0')) {
          wc = (InstructionWithCode *)((ulong)wc & 0xffffffffffff0000);
          lVar11 = *(long *)(lVar8 + 0xf0);
          lVar8 = *(long *)(lVar8 + 0xf8);
          for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
            if (uVar12 < (ulong)((lVar8 - lVar11) / 0x18)) {
              plVar1 = *(long **)(lVar11 + 8 + uVar12 * 0x18);
              for (plVar15 = *(long **)(lVar11 + uVar12 * 0x18); plVar15 != plVar1;
                  plVar15 = plVar15 + 5) {
                if ((pIVar21 != (Instruction *)0x0) && ((Instruction *)*plVar15 == pIVar21)) {
                  *(undefined1 *)((long)&wc + uVar12) = 1;
                }
              }
            }
          }
          if (((byte)wc != 0) && (wc._1_1_ != '\0')) break;
          uVar13 = uVar13 + (byte)wc;
        }
        pIVar21 = this_00;
        pIVar4 = pTVar16->inst;
      }
    }
    pPVar17 = &local_100->inst_pool;
    uVar13 = 0;
    while( true ) {
      uVar12 = (ulong)uVar13;
      pCVar20 = (rewind->code_seq_end).
                super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                .
                super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(rewind->code_seq_end).
                        super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                        .
                        super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar20 >> 4) <= uVar12)
      break;
      if (pCVar20[uVar12].offset != 0) {
        pCVar20 = pCVar20 + uVar12;
        cVar5 = (**(code **)((long)(pCVar20->code->super_Instruction)._vptr_Instruction + 0xd8))();
        if ((cVar5 != '\0') &&
           ((uVar12 == 0 ||
            ((rewind->code_seq_end).
             super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
             .
             super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar13 - 1].offset < pCVar20->offset)))) {
          pIVar9 = (InstructionWithCode *)
                   (**(code **)((long)(pCVar20->code->super_Instruction)._vptr_Instruction + 0xe0))
                             (pCVar20->code,pPVar17);
          pCVar20->code = pIVar9;
          pCVar20->offset = pCVar20->offset + -1;
        }
      }
      uVar13 = uVar13 + 1;
    }
    offset_beg = 0;
    local_118 = (vector<Hpipe::InstructionRewind::CodeSeqItem,std::allocator<Hpipe::InstructionRewind::CodeSeqItem>>
                 *)&rewind->code_seq_beg;
    pIVar14 = (InstructionRewind *)rewind->exec;
    pIVar18 = pIVar14;
    while ((ulong)(((long)(pIVar18->super_Instruction).prev.
                          super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                          super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(pIVar18->super_Instruction).prev.
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         _M_impl.super__Vector_impl_data._M_start) / 0x28) <
           (ulong)(pIVar18 != pIVar14) + 1) {
      iVar7 = 0;
      pIVar19 = pIVar18;
      for (pVVar10 = (pIVar18->super_Instruction).next_rw.
                     super_vector<Hpipe::Vec<Hpipe::Transition>,_std::allocator<Hpipe::Vec<Hpipe::Transition>_>_>
                     .
                     super__Vector_base<Hpipe::Vec<Hpipe::Transition>,_std::allocator<Hpipe::Vec<Hpipe::Transition>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pVVar10 !=
          (pIVar18->super_Instruction).next_rw.
          super_vector<Hpipe::Vec<Hpipe::Transition>,_std::allocator<Hpipe::Vec<Hpipe::Transition>_>_>
          .
          super__Vector_base<Hpipe::Vec<Hpipe::Transition>,_std::allocator<Hpipe::Vec<Hpipe::Transition>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pVVar10 = pVVar10 + 1) {
        for (pTVar16 = (pVVar10->super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                       ).super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            pTVar16 !=
            (pVVar10->super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>).
            super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
            super__Vector_impl_data._M_finish; pTVar16 = pTVar16 + 1) {
          pIVar2 = (InstructionRewind *)pTVar16->inst;
          if (pIVar2 != (InstructionRewind *)0x0) {
            pIVar19 = pIVar2;
          }
          iVar7 = iVar7 + (uint)(pIVar2 != (InstructionRewind *)0x0);
        }
      }
      if (iVar7 != 1) break;
      if (pIVar18 != (InstructionRewind *)0x0) {
        wc = (InstructionWithCode *)
             __dynamic_cast(pIVar18,&Instruction::typeinfo,&InstructionWithCode::typeinfo,0);
        if (wc != (InstructionWithCode *)0x0) {
          if (wc->in_code_seq != false) break;
          if (8 < (ulong)((long)(wc->super_Instruction).cx.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(wc->super_Instruction).cx.pos.
                               super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                               .
                               super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                               ._M_impl.super__Vector_impl_data._M_start)) {
            rewind->offset_ncx = offset_beg;
            rewind->need_rw = true;
            break;
          }
          iVar7 = (*(wc->super_Instruction)._vptr_Instruction[0x11])(wc);
          local_10c = 0xffffffff;
          if ((char)iVar7 != '\0') {
            local_10c = offset_beg;
          }
          std::
          vector<Hpipe::InstructionRewind::CodeSeqItem,std::allocator<Hpipe::InstructionRewind::CodeSeqItem>>
          ::emplace_back<unsigned_int,Hpipe::InstructionWithCode*&>(local_118,&local_10c,&wc);
          wc->in_code_seq = true;
        }
        lVar8 = __dynamic_cast(pIVar18,&Instruction::typeinfo,&InstructionNextChar::typeinfo,0);
        if (((lVar8 != 0) && (*(char *)(lVar8 + 0x174) == '\0')) &&
           ((*(long **)(lVar8 + 0xf0))[1] != **(long **)(lVar8 + 0xf0))) {
          offset_beg = offset_beg + 1;
        }
      }
      pIVar18 = pIVar19;
      pIVar14 = (InstructionRewind *)rewind->exec;
    }
    local_70._M_unused._M_object = &rewind_local;
    local_70._8_8_ = &offset_beg;
    local_58 = std::
               _Function_handler<void_(Hpipe::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/hleclerc[P]Hpipe/src/Hpipe/InstructionGraph.cpp:992:29)>
               ::_M_invoke;
    local_60 = std::
               _Function_handler<void_(Hpipe::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/hleclerc[P]Hpipe/src/Hpipe/InstructionGraph.cpp:992:29)>
               ::_M_manager;
    Instruction::apply_rw
              (&pIVar14->super_Instruction,(function<void_(Hpipe::Instruction_*)> *)&local_70,false)
    ;
    std::_Function_base::~_Function_base((_Function_base *)&local_70);
    pIVar14 = rewind_local;
    if (rewind_local->need_rw == true) {
      pIVar14 = pIVar18;
    }
    Context::without_mark((PC *)&wc,&(pIVar14->super_Instruction).cx);
    std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::operator=(&rewind_local->ncx,(type)&wc);
    std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::~pair((type)&wc);
    pCVar3 = (rewind_local->code_seq_beg).
             super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
             .
             super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pCVar20 = (rewind_local->code_seq_beg).
                   super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                   .
                   super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                   ._M_impl.super__Vector_impl_data._M_start; pCVar20 != pCVar3;
        pCVar20 = pCVar20 + 1) {
      (*(pCVar20->code->super_Instruction)._vptr_Instruction[0x1a])
                (pCVar20->code,&(rewind_local->super_Instruction).running_strs);
      pIVar9 = pCVar20->code;
      if (pIVar9 != (InstructionWithCode *)0x0) {
        lVar8 = __dynamic_cast(pIVar9,&InstructionWithCode::typeinfo,&InstructionBegStr::typeinfo,0)
        ;
        if (lVar8 == 0) {
          lVar8 = __dynamic_cast(pIVar9,&InstructionWithCode::typeinfo,&InstructionEndStr::typeinfo,
                                 0);
          if (lVar8 != 0) {
            Context::rem_string(&(rewind_local->ncx).first,(string *)(lVar8 + 0x188));
          }
        }
        else {
          Context::add_string(&(rewind_local->ncx).first,(string *)(lVar8 + 0x188),
                              *(uint *)(lVar8 + 0x174));
        }
      }
    }
    if (rewind_local->need_rw == false) {
      for (uVar12 = (long)(rewind_local->code_seq_end).
                          super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                          .
                          super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(rewind_local->code_seq_end).
                          super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                          .
                          super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff0; uVar12 != 0;
          uVar12 = uVar12 - 0x10) {
        pCVar20 = (rewind_local->code_seq_end).
                  super_vector<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                  .
                  super__Vector_base<Hpipe::InstructionRewind::CodeSeqItem,_std::allocator<Hpipe::InstructionRewind::CodeSeqItem>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        plVar15 = *(long **)((long)pCVar20 + (uVar12 - 8));
        (**(code **)(*plVar15 + 0xd0))(plVar15,&(rewind_local->super_Instruction).running_strs);
        lVar8 = *(long *)((long)pCVar20 + (uVar12 - 8));
        if (lVar8 != 0) {
          lVar11 = __dynamic_cast(lVar8,&InstructionWithCode::typeinfo,&InstructionBegStr::typeinfo,
                                  0);
          if (lVar11 == 0) {
            lVar8 = __dynamic_cast(lVar8,&InstructionWithCode::typeinfo,&InstructionEndStr::typeinfo
                                   ,0);
            if (lVar8 != 0) {
              Context::rem_string(&(rewind_local->ncx).first,(string *)(lVar8 + 0x188));
            }
          }
          else {
            Context::add_string(&(rewind_local->ncx).first,(string *)(lVar11 + 0x188),
                                *(uint *)(lVar11 + 0x174));
          }
        }
      }
    }
  }
  return;
}

Assistant:

void InstructionGraph::make_rewind_data( InstructionRewind *rewind ) {
    make_rewind_exec( rewind->mark, rewind );

    if ( ! rewind->exec ) {
        rewind->ncx = rewind->cx.without_mark();
        return;
    }

    // read instructions from the end (from OK instruction) until undecidabitity
    InstructionOK *ok = 0;
    unsigned offset_end = 0;
    rewind->exec->apply_rw( [&]( Instruction *inst ) {
        if ( InstructionOK *tr = dynamic_cast<InstructionOK *>( inst ) )
            ok = tr;
    } );
    if ( ok ) {
        for( Instruction *inst = ok, *next = nullptr; ; ) {
            // if in a loop, stop here
            if ( inst->nb_next_rw() >= 1 + bool( inst != ok ) )
                break;

            // some code to register ?
            if ( InstructionWithCode *wc = dynamic_cast<InstructionWithCode *>( inst ) ) {
                // if ambiguity, on a code, we stop here, to let the beg seq take care of it (with a rewind)
                if ( wc->cx.pos.size() >= 2 )
                    break;
                rewind->code_seq_end.emplace_back( wc->data_code() ? offset_end : -1, wc );
                wc->in_code_seq = true;
            }

            // several choices or end ?
            if ( inst->prev.size() != 1 )
                break;

            // advance
            if ( InstructionNextChar *nc = dynamic_cast<InstructionNextChar *>( inst ) ) {
                if ( nc->beg == false ) {
                    bool in[ 2 ] = { false, false }; // in ok, in ko
                    for( unsigned nt = 0; nt < 2; ++nt ) {
                        if ( nt < nc->next_rw.size() ) {
                            for( const Transition &t : nc->next_rw[ nt ] )
                                if ( next && t.inst == next )
                                    in[ nt ] = true;
                        }
                    }
                    // if OK and KO are possible, we don't know if we have to advance or not
                    if ( in[ 0 ] && in[ 1 ] )
                        break;
                    if ( in[ 0 ] )
                        ++offset_end;
                }
            }

            // loop
            next = inst;
            inst = inst->prev[ 0 ].inst;
        }
    }

    // replace _next instruction to non next versions if possible
    for( unsigned num_item = 0; num_item < rewind->code_seq_end.size(); ++num_item ) {
        InstructionRewind::CodeSeqItem &item = rewind->code_seq_end[ num_item ];
        if ( item.offset && item.code->works_on_next() && ( num_item == 0 || rewind->code_seq_end[ num_item - 1 ].offset < item.offset ) ) {
            item.code = item.code->no_works_on_next_clone( inst_pool );
            --item.offset;
        }
    }

    // read instructions from the beginning, until undecidability
    unsigned offset_beg = 0;
    const Context *ncx_beg = 0;
    for( Instruction *inst = rewind->exec; ; ) {
        ncx_beg = &inst->cx;

        // if in a loop, stop here
        if ( inst->prev.size() >= 1 + bool( inst != rewind->exec ) )
            break;

        // several choices / undecidability or no next
        Instruction *next_rw;
        unsigned nb_next_rw = 0;
        for( const Vec<Transition> &n : inst->next_rw ) {
            for( const Transition &t : n ) {
                if ( t.inst ) {
                    next_rw = t.inst;
                    ++nb_next_rw;
                }
            }
        }
        if ( nb_next_rw != 1 )
            break;

        // some code to register ?
        if ( InstructionWithCode *wc = dynamic_cast<InstructionWithCode *>( inst ) ) {
            // already handled by code_seq_end
            if ( wc->in_code_seq )
                break;
            // if ambiguity, we make a rewind on wc
            if ( wc->cx.pos.size() >= 2 ) {
                rewind->offset_ncx = offset_beg;
                rewind->need_rw = true;
                break;
            }
            // else, register in code_seq_beg
            rewind->code_seq_beg.emplace_back( wc->data_code() ? offset_beg : -1, wc );
            wc->in_code_seq = true;
        }

        // advance
        if ( InstructionNextChar *nc = dynamic_cast<InstructionNextChar *>( inst ) ) {
            if ( nc->beg == false && nc->next_rw[ 0 ].size() )
                ++offset_beg;
        }

        //
        inst = next_rw;
    }

    // test if there are some instructions between code_seq_beg and code_seq_end
    rewind->exec->apply_rw( [&]( Instruction *inst ) {
        if ( InstructionWithCode *code = dynamic_cast<InstructionWithCode *>( inst ) ) {
            if ( ! code->in_code_seq ) {
                rewind->offset_ncx = offset_beg;
                rewind->need_rw = true;
            }
        }
    } );

    // restart context
    if ( rewind->need_rw )
        rewind->ncx = ncx_beg->without_mark();
    else
        rewind->ncx = rewind->cx.without_mark();

    // stuff that may change the restart context
    for( const InstructionRewind::CodeSeqItem &csi : rewind->code_seq_beg ) {
        csi.code->update_running_strings( rewind->running_strs );

        if ( InstructionBegStr *bs = dynamic_cast<InstructionBegStr *>( csi.code ) )
            rewind->ncx.first.add_string( bs->var, bs->num_active_item );
        else if ( InstructionEndStr *es = dynamic_cast<InstructionEndStr *>( csi.code ) )
            rewind->ncx.first.rem_string( es->var );
    }
    if ( ! rewind->need_rw ) {
        for( unsigned i = rewind->code_seq_end.size(); i--; ) {
            const InstructionRewind::CodeSeqItem &csi = rewind->code_seq_end[ i ];
            csi.code->update_running_strings( rewind->running_strs );

            if ( InstructionBegStr *bs = dynamic_cast<InstructionBegStr *>( csi.code ) )
                rewind->ncx.first.add_string( bs->var, bs->num_active_item );
            else if ( InstructionEndStr *es = dynamic_cast<InstructionEndStr *>( csi.code ) )
                rewind->ncx.first.rem_string( es->var );
        }

    }

    //    // add save point, remove mark if possible
    //    for( InstructionMark *mark : marks ) {
    //        // make rewind->exec, update flags for mark
    //        bool remove_mark = true;
    //        unsigned num_save = 0;
    //        for( InstructionRewind *rewind : mark->rewinds ) {
    //            if ( rewind->need_rw )
    //                remove_mark = false;
    //            else if ( rewind->code_seq.size() ) {
    //                // add save points
    //                for( InstructionWithCode *code : rewind->code_seq ) {
    //                    if ( not code->data_code() )
    //                        continue;
    //                    Instruction *orig = code->orig;
    //                    while ( orig->prev.size() == 1 and dynamic_cast<InstructionWithCode *>( orig->prev[ 0 ].inst ) )
    //                        orig = orig->prev[ 0 ].inst;
    //                    if ( orig->prev.size() == 1 and dynamic_cast<InstructionSave *>( orig->prev[ 0 ].inst ) ) {
    //                        code->save = static_cast<InstructionSave *>( orig->prev[ 0 ].inst );
    //                        continue;
    //                    }
    //                    code->save = inst_pool << new InstructionSave( orig->cx, num_save++ );
    //                    orig->insert_before_this( code->save, init );
    //                    // code->save->mark = mark;
    //                }
    //            }
    //        }
}